

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndiEa<(moira::Instr)57,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  Ea<(moira::Mode)8,_2> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar4 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar5 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar5 & 0xffff | iVar4 << 0x10;
  if (str->style->syntax == MUSASHI) {
    cVar2 = 'e';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar2;
      cVar2 = "eori"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
      pcVar6 = str->ptr;
    }
    else {
      iVar4 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar4);
    }
    str->ptr = pcVar6 + 1;
    *pcVar6 = '#';
    StrWriter::operator<<(str,(UInt)(uVar3 & 0xffff));
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar1 = str->style->syntax;
    if ((MUSASHI < SVar1) || (cVar2 = ' ', (0x13U >> (SVar1 & 0x1f) & 1) == 0)) goto LAB_0020f7bd;
  }
  else {
    cVar2 = 'e';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar2;
      cVar2 = "eori"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pcVar6 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
      pcVar6 = str->ptr;
    }
    else {
      iVar4 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar4);
    }
    str->ptr = pcVar6 + 1;
    *pcVar6 = '#';
    StrWriter::operator<<(str,(Int)(int)(short)uVar3);
    cVar2 = ',';
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = cVar2;
LAB_0020f7bd:
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmAndiEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead<S>(addr);
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (str.style.syntax == Syntax::MUSASHI) {
        str << Ins<I>{} << Sz<S>{} << str.tab << Imu<S>{src} << Sep{} << dst;
    } else {
        str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(src) << "," << dst;
    }
}